

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O1

string * testing::internal::FormatMatcherDescription
                   (string *__return_storage_ptr__,bool negation,char *matcher_name,
                   Strings *param_values)

{
  pointer pcVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string local_38;
  
  ConvertIdentifierNameToWords_abi_cxx11_(&local_58,(internal *)matcher_name,matcher_name);
  if ((param_values->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (param_values->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    JoinAsTuple(&local_38,param_values);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_38,0,0," ",1);
    local_78._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar4) {
      local_78.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_78._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_58,local_78._M_dataplus._M_p,local_78._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (negation) {
    std::operator+(&local_78,"not (",&local_58);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_78,")");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar4) {
      uVar2 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
  }
  if ((negation) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2)) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ std::string FormatMatcherDescription(bool negation,
                                                const char* matcher_name,
                                                const Strings& param_values) {
  std::string result = ConvertIdentifierNameToWords(matcher_name);
  if (param_values.size() >= 1) result += " " + JoinAsTuple(param_values);
  return negation ? "not (" + result + ")" : result;
}